

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMesh.h
# Opt level: O1

void __thiscall irr::scene::SMesh::recalculateBoundingBox(SMesh *this)

{
  aabbox3d<float> *this_00;
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  bool bVar4;
  long lVar5;
  aabbox3d<float> *this_01;
  ulong uVar6;
  
  lVar5 = *(long *)&(this->super_IMesh).field_0x8;
  if ((int)((ulong)(*(long *)&(this->super_IMesh).field_0x10 - lVar5) >> 3) != 0) {
    this_00 = &this->BoundingBox;
    uVar6 = 0;
    bVar2 = false;
    do {
      this_01 = (aabbox3d<float> *)(**(code **)(**(long **)(lVar5 + uVar6 * 8) + 0x50))();
      bVar4 = core::aabbox3d<float>::isEmpty(this_01);
      if (!bVar4) {
        if (bVar2) {
          core::aabbox3d<float>::addInternalBox(this_00,this_01);
        }
        else {
          fVar3 = (this_01->MaxEdge).Z;
          (this->BoundingBox).MaxEdge.Y = (this_01->MaxEdge).Y;
          (this->BoundingBox).MaxEdge.Z = fVar3;
          fVar3 = (this_01->MinEdge).Y;
          uVar1 = *(undefined8 *)&(this_01->MinEdge).Z;
          (this_00->MinEdge).X = (this_01->MinEdge).X;
          (this_00->MinEdge).Y = fVar3;
          *(undefined8 *)&(this->BoundingBox).MinEdge.Z = uVar1;
          bVar2 = true;
        }
      }
      uVar6 = uVar6 + 1;
      lVar5 = *(long *)&(this->super_IMesh).field_0x8;
    } while (uVar6 < ((ulong)(*(long *)&(this->super_IMesh).field_0x10 - lVar5) >> 3 & 0xffffffff));
    if (bVar2) {
      return;
    }
  }
  (this->BoundingBox).MaxEdge.X = 0.0;
  (this->BoundingBox).MaxEdge.Y = 0.0;
  (this->BoundingBox).MaxEdge.Z = 0.0;
  (this->BoundingBox).MinEdge.Z = 0.0;
  (this->BoundingBox).MinEdge.X = 0.0;
  (this->BoundingBox).MinEdge.Y = 0.0;
  return;
}

Assistant:

void recalculateBoundingBox()
	{
		bool hasMeshBufferBBox = false;
		for (u32 i = 0; i < MeshBuffers.size(); ++i) {
			const core::aabbox3df &bb = MeshBuffers[i]->getBoundingBox();
			if (!bb.isEmpty()) {
				if (!hasMeshBufferBBox) {
					hasMeshBufferBBox = true;
					BoundingBox = bb;
				} else {
					BoundingBox.addInternalBox(bb);
				}
			}
		}

		if (!hasMeshBufferBBox)
			BoundingBox.reset(0.0f, 0.0f, 0.0f);
	}